

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::InterpolateOrientation(ChElementShellReissner4 *this)

{
  ChMatrix33<double> *pCVar1;
  ChVector<double> *pCVar2;
  ChMatrix33<double> (*paCVar3) [4];
  ChVector<double> *pCVar4;
  int i;
  long lVar5;
  long lVar6;
  ChVector<double> phi_tilde_0;
  ChMatrix33<double> T_overline_Gamma_tilde_i;
  ChMatrix33<double> Gammai;
  ChMatrix33<double> Ri;
  ChMatrix33<double> DRot_I_phi_tilde_n_MT_T_overline [4];
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_258;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_250;
  ChVector<double> local_248;
  ChMatrix33<double> *local_230;
  ChMatrix33<double> *local_228;
  ChMatrix33<double> *local_220;
  ChMatrix33<double> local_1e8;
  ChMatrix33<double> local_1a0;
  ChMatrix33<double> local_158 [4];
  
  pCVar4 = this->phi_tilde_n;
  pCVar1 = &this->T_overline;
  lVar5 = 0;
  do {
    rotutils::DRot_I(&local_1a0,pCVar4);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_1a0;
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar1;
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)
               ((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + lVar5),
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)&local_1e8);
    lVar5 = lVar5 + 0x48;
    pCVar4 = pCVar4 + 1;
  } while (lVar5 != 0x120);
  pCVar4 = this->phi_tilde_n;
  paCVar3 = this->Phi_Delta_i;
  lVar5 = 0;
  do {
    Interp(pCVar4,(double *)(&xi_i + lVar5 * 2));
    pCVar2 = this->phi_tilde_i + lVar5;
    pCVar2->m_data[0] = (double)local_230;
    pCVar2->m_data[1] = (double)local_228;
    pCVar2->m_data[2] = (double)local_220;
    rotutils::RotAndDRot(pCVar2,&local_1a0,&local_1e8);
    local_220 = this->iTa_i + lVar5;
    local_228 = &local_1a0;
    local_230 = pCVar1;
    ChMatrix33<double>::operator=
              (this->T_i + lVar5,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_230);
    local_248.m_data[1] = (double)&local_1e8;
    local_248.m_data[0] = (double)pCVar1;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((ChMatrix33<double> *)&local_230,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_248);
    lVar6 = 0;
    do {
      local_248.m_data[1] =
           (double)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + lVar6);
      local_248.m_data[0] = (double)&local_230;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)(*paCVar3)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar6),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_248);
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x120);
    lVar5 = lVar5 + 1;
    paCVar3 = paCVar3 + 1;
  } while (lVar5 != 4);
  Interp(pCVar4,(double *)xi_0);
  rotutils::Rot((ChMatrix33<double> *)&local_230,&local_248);
  local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)pCVar1;
  local_250 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_230;
  ChMatrix33<double>::operator=
            (&this->T_0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_258);
  paCVar3 = this->Phi_Delta_A;
  lVar5 = 0;
  do {
    Interp(pCVar4,(double *)(xi_A + lVar5 * 0x10));
    pCVar2 = this->phi_tilde_A + lVar5;
    pCVar2->m_data[0] = (double)local_230;
    pCVar2->m_data[1] = (double)local_228;
    pCVar2->m_data[2] = (double)local_220;
    rotutils::RotAndDRot(pCVar2,&local_1a0,&local_1e8);
    local_220 = this->iTa_A + lVar5;
    local_230 = pCVar1;
    local_228 = &local_1a0;
    ChMatrix33<double>::operator=
              (this->T_A + lVar5,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_230);
    local_250 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)&local_1e8;
    local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)pCVar1;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((ChMatrix33<double> *)&local_230,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_258);
    lVar6 = 0;
    do {
      local_250 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                   *)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + lVar6);
      local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                   *)&local_230;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)(*paCVar3)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar6),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_258);
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x120);
    lVar5 = lVar5 + 1;
    paCVar3 = paCVar3 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void ChElementShellReissner4::InterpolateOrientation() {
    ChMatrix33<> DRot_I_phi_tilde_n_MT_T_overline[NUMNODES];
    ChMatrix33<> Ri, Gammai;
    for (int n = 0; n < NUMNODES; n++) {
        ChMatrix33<> mDrot_I = rotutils::DRot_I(phi_tilde_n[n]);
#ifdef CHSIMPLIFY_DROT
        mDrot_I = ChMatrix33<>(1);
#endif
        DRot_I_phi_tilde_n_MT_T_overline[n] = mDrot_I * T_overline.transpose();
    }
    for (int i = 0; i < NUMIP; i++) {
        phi_tilde_i[i] = Interp(phi_tilde_n, xi_i[i]);
        rotutils::RotAndDRot(phi_tilde_i[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_i[i] = T_overline * Ri * iTa_i[i];
        ChMatrix33<> T_overline_Gamma_tilde_i(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_i[i][n] = T_overline_Gamma_tilde_i * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
    ChVector<> phi_tilde_0 = Interp(phi_tilde_n, xi_0);
    T_0 = T_overline * rotutils::Rot(phi_tilde_0);
    for (int i = 0; i < NUMSSEP; i++) {
        phi_tilde_A[i] = Interp(phi_tilde_n, xi_A[i]);
        rotutils::RotAndDRot(phi_tilde_A[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_A[i] = T_overline * Ri * iTa_A[i];
        ChMatrix33<> T_overline_Gamma_tilde_A(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_A[i][n] = T_overline_Gamma_tilde_A * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
}